

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# to_string_converters.h
# Opt level: O2

string * __thiscall
common::vector_to_string_abi_cxx11_
          (string *__return_storage_ptr__,common *this,
          vector<join::JoinResultElement,_std::allocator<join::JoinResultElement>_> *v)

{
  double __x;
  int __val;
  long lVar1;
  int *piVar2;
  ulong uVar3;
  long lVar4;
  int *piVar5;
  __normal_iterator<join::JoinResultElement_*,_std::vector<join::JoinResultElement,_std::allocator<join::JoinResultElement>_>_>
  __i;
  long lVar6;
  string *s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  string local_110;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  lVar4 = *(long *)this;
  lVar1 = *(long *)(this + 8);
  if (lVar4 != lVar1) {
    uVar3 = lVar1 - lVar4 >> 4;
    lVar6 = 0x3f;
    if (uVar3 != 0) {
      for (; uVar3 >> lVar6 == 0; lVar6 = lVar6 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<join::JoinResultElement*,std::vector<join::JoinResultElement,std::allocator<join::JoinResultElement>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<common::vector_to_string[abi:cxx11](std::vector<join::JoinResultElement,std::allocator<join::JoinResultElement>>&)::__0>>
              (lVar4,lVar1,((uint)lVar6 ^ 0x3f) * 2 ^ 0x7e);
    if (lVar1 - lVar4 < 0x101) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<join::JoinResultElement*,std::vector<join::JoinResultElement,std::allocator<join::JoinResultElement>>>,__gnu_cxx::__ops::_Iter_comp_iter<common::vector_to_string[abi:cxx11](std::vector<join::JoinResultElement,std::allocator<join::JoinResultElement>>&)::__0>>
                (lVar4,lVar1);
    }
    else {
      lVar6 = lVar4 + 0x100;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<join::JoinResultElement*,std::vector<join::JoinResultElement,std::allocator<join::JoinResultElement>>>,__gnu_cxx::__ops::_Iter_comp_iter<common::vector_to_string[abi:cxx11](std::vector<join::JoinResultElement,std::allocator<join::JoinResultElement>>&)::__0>>
                (lVar4,lVar6);
      for (; lVar6 != lVar1; lVar6 = lVar6 + 0x10) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<join::JoinResultElement*,std::vector<join::JoinResultElement,std::allocator<join::JoinResultElement>>>,__gnu_cxx::__ops::_Val_comp_iter<common::vector_to_string[abi:cxx11](std::vector<join::JoinResultElement,std::allocator<join::JoinResultElement>>&)::__0>>
                  (lVar6);
      }
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  piVar2 = *(int **)(this + 8);
  for (piVar5 = *(int **)this; piVar5 != piVar2; piVar5 = piVar5 + 4) {
    __val = piVar5[1];
    __x = *(double *)(piVar5 + 2);
    std::__cxx11::to_string(&local_f0,*piVar5);
    std::operator+(&local_90,"{",&local_f0);
    std::operator+(&local_150,&local_90,",");
    std::__cxx11::to_string(&local_b0,__val);
    std::operator+(&local_d0,&local_150,&local_b0);
    std::operator+(&local_130,&local_d0,",");
    lVar4 = lround(__x);
    std::__cxx11::to_string(&local_110,lVar4);
    std::operator+(&local_70,&local_130,&local_110);
    std::operator+(&local_50,&local_70,"},");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_f0);
  }
  std::__cxx11::string::pop_back();
  return __return_storage_ptr__;
}

Assistant:

std::string vector_to_string(std::vector<join::JoinResultElement>& v) {
  // Sort the vector using lambda function implemented here.
  std::sort(v.begin(), v.end(), [](const join::JoinResultElement& a,
                                   const join::JoinResultElement& b){
    if (a.tree_id_1 < b.tree_id_1) {
      return true;
    } else if (a.tree_id_1 == b.tree_id_1) {
      if (a.tree_id_2 < b.tree_id_2) {
        return true;
      } else if (a.tree_id_2 == b.tree_id_2) {
        if (a.ted_value < b.ted_value) {
          return true;
        }
      }
    }
    return false;
  });
  // Convert vector to string.
  std::string s;
  for (auto e : v) {
    s += "{" + std::to_string(e.tree_id_1) + "," + std::to_string(e.tree_id_2)
        + "," + std::to_string(std::lround(e.ted_value)) + "},";
  }
  s.pop_back(); // Delete the last comma.
  return s;
}